

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareRepeatedRep
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer *ppSVar1;
  pointer *ppSVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  MapKeyComparator *key_comparator;
  Nonnull<const_char_*> pcVar8;
  Nonnull<const_char_*> extraout_RAX;
  undefined8 extraout_RAX_00;
  bool bVar9;
  long lVar10;
  int index;
  SpecificField *pSVar11;
  iterator iVar12;
  byte bVar13;
  int index_00;
  ulong uVar14;
  long lVar15;
  byte bVar16;
  Metadata MVar17;
  Metadata MVar18;
  int local_fc;
  vector<int,_std::allocator<int>_> match_list1;
  SpecificField specific_field;
  vector<int,_std::allocator<int>_> match_list2;
  LogMessageFatal local_40;
  
  bVar16 = 0;
  bVar13 = repeated_field->field_0x1;
  bVar9 = (bool)((bVar13 & 0x20) >> 5);
  if (0xbf < bVar13 == bVar9) {
    pcVar8 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar9,0xbf < bVar13,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar8 != (Nonnull<const_char_*>)0x0) {
    CompareRepeatedRep();
    if (match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(extraout_RAX_00);
  }
  if ((repeated_field->field_0x1 & 0x20) == 0) {
    CompareRepeatedRep((MessageDifferencer *)&specific_field);
    pcVar8 = extraout_RAX;
LAB_002d246c:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer.cc"
               ,0x519,pcVar8);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
  }
  MVar17 = Message::GetMetadata(message1);
  MVar18 = Message::GetMetadata(message2);
  uVar6 = Reflection::FieldSize(MVar17.reflection,message1,repeated_field);
  uVar7 = Reflection::FieldSize(MVar18.reflection,message2,repeated_field);
  bVar9 = IsTreatedAsSubset(this,repeated_field);
  if (this->reporter_ == (Reporter *)0x0 && (uVar6 != uVar7 && ((int)uVar7 <= (int)uVar6 || !bVar9))
     ) {
    return false;
  }
  match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  key_comparator = GetMapKeyComparator(this,repeated_field);
  bVar3 = IsTreatedAsSmartList(this,repeated_field);
  if ((key_comparator != (MapKeyComparator *)0x0) ||
     (bVar4 = IsTreatedAsSet(this,repeated_field), bVar4)) {
    bVar4 = false;
  }
  else {
    bVar4 = IsTreatedAsSmartSet(this,repeated_field);
    bVar4 = !bVar4 && !bVar3;
  }
  if ((bVar4) ||
     (bVar5 = MatchRepeatedFieldIndices
                        (this,message1,message2,unpacked_any,repeated_field,key_comparator,
                         parent_fields,&match_list1,&match_list2),
     bVar5 || this->reporter_ != (Reporter *)0x0)) {
    specific_field.unknown_field_number = -1;
    specific_field.unknown_field_type = TYPE_VARINT;
    specific_field.index = -1;
    specific_field.new_index = -1;
    specific_field.map_entry1 = (Message *)0x0;
    specific_field.map_entry2 = (Message *)0x0;
    specific_field.unknown_field_set1 = (UnknownFieldSet *)0x0;
    specific_field.unknown_field_set2 = (UnknownFieldSet *)0x0;
    specific_field.unknown_field_index1 = -1;
    specific_field.unknown_field_index2 = -1;
    specific_field.forced_compare_no_presence_ = false;
    bVar13 = 0;
    specific_field.message1 = message1;
    specific_field.message2 = message2;
    specific_field.unpacked_any = unpacked_any;
    specific_field.field = repeated_field;
    if ((0 < (int)uVar6) && (!(bool)((int)uVar7 < 1 & bVar4))) {
      ppSVar1 = &(parent_fields->
                 super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      uVar14 = 0;
      local_fc = 0;
      bVar13 = 0;
      do {
        index_00 = (int)uVar14;
        if ((bVar4) ||
           (match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14] != -1)) {
          if ((bVar3) &&
             (local_fc <
              match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14])) {
            lVar15 = (long)local_fc;
            index = local_fc;
            do {
              if (lVar15 < 0) {
                pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                   (0,lVar15,"0 <= j");
              }
              else {
                pcVar8 = (Nonnull<const_char_*>)0x0;
              }
              if (pcVar8 != (Nonnull<const_char_*>)0x0) goto LAB_002d246c;
              if (this->reporter_ == (Reporter *)0x0) goto LAB_002d2230;
              specific_field.index = index;
              AddSpecificNewIndex(&specific_field,message2,repeated_field,index);
              iVar12._M_current =
                   (parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar12._M_current ==
                  (parent_fields->
                  super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                ::
                _M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                          ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                            *)parent_fields,iVar12,&specific_field);
              }
              else {
                pSVar11 = &specific_field;
                for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
                  (iVar12._M_current)->message1 = pSVar11->message1;
                  pSVar11 = (SpecificField *)((long)pSVar11 + (ulong)bVar16 * -0x10 + 8);
                  iVar12._M_current = iVar12._M_current + (ulong)bVar16 * -0x10 + 8;
                }
                ppSVar2 = &(parent_fields->
                           super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppSVar2 = *ppSVar2 + 1;
              }
              (*this->reporter_->_vptr_Reporter[2])(this->reporter_,message1,message2,parent_fields)
              ;
              ppSVar2 = &(parent_fields->
                         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppSVar2 = *ppSVar2 + -1;
              match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15] = -2;
              lVar15 = lVar15 + 1;
              index = index + 1;
              bVar13 = 1;
            } while (lVar15 < match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar14]);
          }
          AddSpecificIndex(&specific_field,message1,repeated_field,index_00);
          if (bVar4) {
            AddSpecificNewIndex(&specific_field,message2,repeated_field,index_00);
          }
          else {
            AddSpecificNewIndex(&specific_field,message2,repeated_field,
                                match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar14]);
            local_fc = match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14] + 1;
          }
          bVar5 = CompareFieldValueUsingParentFields
                            (this,message1,message2,unpacked_any,repeated_field,index_00,
                             specific_field.new_index,parent_fields);
          if (bVar5) {
            if (this->reporter_ != (Reporter *)0x0) {
              if ((specific_field.index != specific_field.new_index) &&
                 ((((specific_field.field)->type_ != '\v' ||
                   (bVar5 = FieldDescriptor::is_map_message_type(specific_field.field), !bVar5)) &&
                  (this->report_moves_ == true)))) {
                iVar12._M_current =
                     (parent_fields->
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (iVar12._M_current ==
                    (parent_fields->
                    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                  ::
                  _M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                            ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                              *)parent_fields,iVar12,&specific_field);
                }
                else {
                  pSVar11 = &specific_field;
                  for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
                    (iVar12._M_current)->message1 = pSVar11->message1;
                    pSVar11 = (SpecificField *)((long)pSVar11 + (ulong)bVar16 * -0x10 + 8);
                    iVar12._M_current = iVar12._M_current + (ulong)bVar16 * -0x10 + 8;
                  }
                  *ppSVar1 = *ppSVar1 + 1;
                }
                (*this->reporter_->_vptr_Reporter[5])
                          (this->reporter_,message1,message2,parent_fields);
                goto LAB_002d21f9;
              }
            }
            bVar5 = true;
            if ((this->report_matches_ == true) && (this->reporter_ != (Reporter *)0x0)) {
              iVar12._M_current =
                   (parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar12._M_current ==
                  (parent_fields->
                  super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                ::
                _M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                          ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                            *)parent_fields,iVar12,&specific_field);
              }
              else {
                pSVar11 = &specific_field;
                for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (iVar12._M_current)->message1 = pSVar11->message1;
                  pSVar11 = (SpecificField *)((long)pSVar11 + (ulong)bVar16 * -0x10 + 8);
                  iVar12._M_current = iVar12._M_current + (ulong)bVar16 * -0x10 + 8;
                }
                *ppSVar1 = *ppSVar1 + 1;
              }
              (*this->reporter_->_vptr_Reporter[6])(this->reporter_,message1,message2,parent_fields)
              ;
LAB_002d21f9:
              *ppSVar1 = *ppSVar1 + -1;
              bVar5 = true;
            }
          }
          else {
            if (this->reporter_ != (Reporter *)0x0) {
              iVar12._M_current =
                   (parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar12._M_current ==
                  (parent_fields->
                  super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                ::
                _M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                          ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                            *)parent_fields,iVar12,&specific_field);
              }
              else {
                pSVar11 = &specific_field;
                for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (iVar12._M_current)->message1 = pSVar11->message1;
                  pSVar11 = (SpecificField *)((long)pSVar11 + (ulong)bVar16 * -0x10 + 8);
                  iVar12._M_current = iVar12._M_current + (ulong)bVar16 * -0x10 + 8;
                }
                *ppSVar1 = *ppSVar1 + 1;
              }
              bVar13 = 1;
              (*this->reporter_->_vptr_Reporter[4])(this->reporter_,message1,message2,parent_fields)
              ;
              goto LAB_002d21f9;
            }
            bVar5 = false;
          }
          if (!bVar5) {
LAB_002d2230:
            bVar3 = false;
            goto LAB_002d2232;
          }
        }
        else if (bVar3) {
          if (this->reporter_ == (Reporter *)0x0) goto LAB_002d2230;
          AddSpecificIndex(&specific_field,message1,repeated_field,index_00);
          iVar12._M_current =
               (parent_fields->
               super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (parent_fields->
              super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
            ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                      ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                        *)parent_fields,iVar12,&specific_field);
          }
          else {
            pSVar11 = &specific_field;
            for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
              (iVar12._M_current)->message1 = pSVar11->message1;
              pSVar11 = (SpecificField *)((long)pSVar11 + (ulong)bVar16 * -0x10 + 8);
              iVar12._M_current = iVar12._M_current + (ulong)bVar16 * -0x10 + 8;
            }
            ppSVar2 = &(parent_fields->
                       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar2 = *ppSVar2 + 1;
          }
          (*this->reporter_->_vptr_Reporter[3])(this->reporter_,message1,message2,parent_fields);
          ppSVar2 = &(parent_fields->
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar2 = *ppSVar2 + -1;
          match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar14] = -2;
          bVar13 = 1;
        }
        uVar14 = uVar14 + 1;
      } while ((uVar14 < uVar6) && (!(bool)((long)(int)uVar7 <= (long)uVar14 & bVar4)));
    }
    bVar3 = true;
LAB_002d2232:
    if (bVar3) {
      if (0 < (int)uVar7) {
        uVar14 = 0;
        do {
          if (bVar4) {
            if ((long)(int)uVar6 <= (long)uVar14) {
LAB_002d2283:
              if (!bVar9) {
                bVar13 = 1;
              }
              if (this->reporter_ != (Reporter *)0x0) {
                specific_field.index = (int)uVar14;
                AddSpecificNewIndex(&specific_field,message2,repeated_field,(int)uVar14);
                iVar12._M_current =
                     (parent_fields->
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (iVar12._M_current ==
                    (parent_fields->
                    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                  ::
                  _M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                            ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                              *)parent_fields,iVar12,&specific_field);
                }
                else {
                  pSVar11 = &specific_field;
                  for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
                    (iVar12._M_current)->message1 = pSVar11->message1;
                    pSVar11 = (SpecificField *)((long)pSVar11 + (ulong)bVar16 * -0x10 + 8);
                    iVar12._M_current = iVar12._M_current + (ulong)bVar16 * -0x10 + 8;
                  }
                  ppSVar1 = &(parent_fields->
                             super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppSVar1 = *ppSVar1 + 1;
                }
                (*this->reporter_->_vptr_Reporter[2])
                          (this->reporter_,message1,message2,parent_fields);
                ppSVar1 = &(parent_fields->
                           super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppSVar1 = *ppSVar1 + -1;
              }
            }
          }
          else if (match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14] == -1) goto LAB_002d2283;
          uVar14 = uVar14 + 1;
        } while (uVar7 != uVar14);
      }
      if (0 < (int)uVar6) {
        uVar14 = 0;
        do {
          if (bVar4) {
            if ((long)(int)uVar7 <= (long)uVar14) {
LAB_002d2356:
              if (this->reporter_ == (Reporter *)0x0) {
                __assert_fail("reporter_ != nullptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer.cc"
                              ,0x55b,
                              "bool google::protobuf::util::MessageDifferencer::CompareRepeatedRep(const Message &, const Message &, int, const FieldDescriptor *, std::vector<SpecificField> *)"
                             );
              }
              AddSpecificIndex(&specific_field,message1,repeated_field,(int)uVar14);
              iVar12._M_current =
                   (parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar12._M_current ==
                  (parent_fields->
                  super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                ::
                _M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                          ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                            *)parent_fields,iVar12,&specific_field);
              }
              else {
                pSVar11 = &specific_field;
                for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (iVar12._M_current)->message1 = pSVar11->message1;
                  pSVar11 = (SpecificField *)((long)pSVar11 + (ulong)bVar16 * -0x10 + 8);
                  iVar12._M_current = iVar12._M_current + (ulong)bVar16 * -0x10 + 8;
                }
                ppSVar1 = &(parent_fields->
                           super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppSVar1 = *ppSVar1 + 1;
              }
              (*this->reporter_->_vptr_Reporter[3])(this->reporter_,message1,message2,parent_fields)
              ;
              ppSVar1 = &(parent_fields->
                         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppSVar1 = *ppSVar1 + -1;
              bVar13 = 1;
            }
          }
          else if (match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14] == -1) goto LAB_002d2356;
          uVar14 = uVar14 + 1;
        } while (uVar6 != uVar14);
      }
      bVar9 = (bool)(bVar13 ^ 1);
      goto LAB_002d23dd;
    }
  }
  bVar9 = false;
LAB_002d23dd:
  if (match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar9;
}

Assistant:

bool MessageDifferencer::CompareRepeatedRep(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    std::vector<SpecificField>* parent_fields) {
  // the input FieldDescriptor is guaranteed to be repeated field.
  ABSL_DCHECK(repeated_field->is_repeated());
  const Reflection* reflection1 = message1.GetReflection();
  const Reflection* reflection2 = message2.GetReflection();

  const int count1 = reflection1->FieldSize(message1, repeated_field);
  const int count2 = reflection2->FieldSize(message2, repeated_field);
  const bool treated_as_subset = IsTreatedAsSubset(repeated_field);

  // If the field is not treated as subset and no detailed reports is needed,
  // we do a quick check on the number of the elements to avoid unnecessary
  // comparison.
  if (count1 != count2 && reporter_ == nullptr && !treated_as_subset) {
    return false;
  }
  // A match can never be found if message1 has more items than message2.
  if (count1 > count2 && reporter_ == nullptr) {
    return false;
  }

  // These two list are used for store the index of the correspondent
  // element in peer repeated field.
  std::vector<int> match_list1;
  std::vector<int> match_list2;

  const MapKeyComparator* key_comparator = GetMapKeyComparator(repeated_field);
  bool smart_list = IsTreatedAsSmartList(repeated_field);
  bool simple_list = key_comparator == nullptr &&
                     !IsTreatedAsSet(repeated_field) &&
                     !IsTreatedAsSmartSet(repeated_field) && !smart_list;

  // For simple lists, we avoid matching repeated field indices, saving the
  // memory allocations that would otherwise be needed for match_list1 and
  // match_list2.
  if (!simple_list) {
    // Try to match indices of the repeated fields. Return false if match fails.
    if (!MatchRepeatedFieldIndices(
            message1, message2, unpacked_any, repeated_field, key_comparator,
            *parent_fields, &match_list1, &match_list2) &&
        reporter_ == nullptr) {
      return false;
    }
  }

  bool fieldDifferent = false;
  SpecificField specific_field;
  specific_field.message1 = &message1;
  specific_field.message2 = &message2;
  specific_field.unpacked_any = unpacked_any;
  specific_field.field = repeated_field;

  // At this point, we have already matched pairs of fields (with the reporting
  // to be done later). Now to check if the paired elements are different.
  int next_unmatched_index = 0;
  for (int i = 0; i < count1; i++) {
    if (simple_list && i >= count2) {
      break;
    }
    if (!simple_list && match_list1[i] == -1) {
      if (smart_list) {
        if (reporter_ == nullptr) return false;
        AddSpecificIndex(&specific_field, message1, repeated_field, i);
        parent_fields->push_back(specific_field);
        reporter_->ReportDeleted(message1, message2, *parent_fields);
        parent_fields->pop_back();
        fieldDifferent = true;
        // Use -2 to mark this element has been reported.
        match_list1[i] = -2;
      }
      continue;
    }
    if (smart_list) {
      for (int j = next_unmatched_index; j < match_list1[i]; ++j) {
        ABSL_CHECK_LE(0, j);
        if (reporter_ == nullptr) return false;
        specific_field.index = j;
        AddSpecificNewIndex(&specific_field, message2, repeated_field, j);
        parent_fields->push_back(specific_field);
        reporter_->ReportAdded(message1, message2, *parent_fields);
        parent_fields->pop_back();
        fieldDifferent = true;
        // Use -2 to mark this element has been reported.
        match_list2[j] = -2;
      }
    }
    AddSpecificIndex(&specific_field, message1, repeated_field, i);
    if (simple_list) {
      AddSpecificNewIndex(&specific_field, message2, repeated_field, i);
    } else {
      AddSpecificNewIndex(&specific_field, message2, repeated_field,
                          match_list1[i]);
      next_unmatched_index = match_list1[i] + 1;
    }

    const bool result = CompareFieldValueUsingParentFields(
        message1, message2, unpacked_any, repeated_field, i,
        specific_field.new_index, parent_fields);

    // If we have found differences, either report them or terminate if
    // no reporter is present. Note that ReportModified, ReportMoved, and
    // ReportMatched are all mutually exclusive.
    if (!result) {
      if (reporter_ == nullptr) return false;
      parent_fields->push_back(specific_field);
      reporter_->ReportModified(message1, message2, *parent_fields);
      parent_fields->pop_back();
      fieldDifferent = true;
    } else if (reporter_ != nullptr &&
               specific_field.index != specific_field.new_index &&
               !specific_field.field->is_map() && report_moves_) {
      parent_fields->push_back(specific_field);
      reporter_->ReportMoved(message1, message2, *parent_fields);
      parent_fields->pop_back();
    } else if (report_matches_ && reporter_ != nullptr) {
      parent_fields->push_back(specific_field);
      reporter_->ReportMatched(message1, message2, *parent_fields);
      parent_fields->pop_back();
    }
  }

  // Report any remaining additions or deletions.
  for (int i = 0; i < count2; ++i) {
    if (!simple_list && match_list2[i] != -1) continue;
    if (simple_list && i < count1) continue;
    if (!treated_as_subset) {
      fieldDifferent = true;
    }

    if (reporter_ == nullptr) continue;
    specific_field.index = i;
    AddSpecificNewIndex(&specific_field, message2, repeated_field, i);
    parent_fields->push_back(specific_field);
    reporter_->ReportAdded(message1, message2, *parent_fields);
    parent_fields->pop_back();
  }

  for (int i = 0; i < count1; ++i) {
    if (!simple_list && match_list1[i] != -1) continue;
    if (simple_list && i < count2) continue;
    assert(reporter_ != nullptr);
    AddSpecificIndex(&specific_field, message1, repeated_field, i);
    parent_fields->push_back(specific_field);
    reporter_->ReportDeleted(message1, message2, *parent_fields);
    parent_fields->pop_back();
    fieldDifferent = true;
  }
  return !fieldDifferent;
}